

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_RECHARGE(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  uint32_t uVar3;
  _Bool local_51;
  wchar_t ease_of_recharge;
  _Bool none_left;
  object *destroyed;
  char *s;
  char *q;
  object *poStack_30;
  _Bool used;
  object *obj;
  wchar_t itemmode;
  wchar_t strength;
  wchar_t t;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  obj._4_4_ = (context->value).base;
  obj._0_4_ = 0x406;
  q._7_1_ = 0;
  context->ident = true;
  player->upkeep->recharge_pow = obj._4_4_;
  s = "Recharge which item? ";
  destroyed = (object *)anon_var_dwarf_27ad8;
  _t = context;
  if (context->cmd == (command_conflict *)0x0) {
    _Var1 = get_item(&stack0xffffffffffffffd0,"Recharge which item? ",
                     "You have nothing to recharge.",CMD_NULL,tval_can_have_charges,L'І');
    if (!_Var1) {
      return (_Bool)(q._7_1_ & 1);
    }
  }
  else {
    wVar2 = cmd_get_item((command *)context->cmd,"tgtitem",&stack0xffffffffffffffd0,
                         "Recharge which item? ","You have nothing to recharge.",
                         tval_can_have_charges,L'І');
    if (wVar2 != L'\0') {
      return (_Bool)(q._7_1_ & 1);
    }
  }
  strength = recharge_failure_chance(poStack_30,obj._4_4_);
  if ((strength < L'\x02') || (uVar3 = Rand_div(strength), uVar3 == 0)) {
    local_51 = false;
    msg("The recharge backfires!");
    msg("There is a bright flash of light.");
    _Var1 = object_is_carried(player,poStack_30);
    if (_Var1) {
      _ease_of_recharge = gear_object_for_use(player,poStack_30,L'\x01',true,&local_51);
    }
    else {
      _ease_of_recharge = floor_object_for_use(player,poStack_30,L'\x01',true,&local_51);
    }
    if (_ease_of_recharge->known != (object *)0x0) {
      object_delete((chunk *)player->cave,(chunk *)0x0,&_ease_of_recharge->known);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,(object **)&ease_of_recharge);
  }
  else {
    itemmode = obj._4_4_ / (10 - (100 - poStack_30->kind->level) / 10) + L'\x01';
    if (L'\0' < itemmode) {
      uVar3 = Rand_div(itemmode);
      poStack_30->pval = poStack_30->pval + (short)uVar3 + 3;
    }
  }
  player->upkeep->notice = player->upkeep->notice | 1;
  player->upkeep->redraw = player->upkeep->redraw | 0x20000;
  return true;
}

Assistant:

bool effect_handler_RECHARGE(effect_handler_context_t *context)
{
	int i, t;
	int strength = context->value.base;
	int itemmode = (USE_INVEN | USE_FLOOR | SHOW_RECHARGE);
	struct object *obj;
	bool used = false;
	const char *q, *s;

	/* Immediately obvious */
	context->ident = true;

	/* Used to show recharge failure rates */
	player->upkeep->recharge_pow = strength;

	/* Get an item */
	q = "Recharge which item? ";
	s = "You have nothing to recharge.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_can_have_charges, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, tval_can_have_charges, itemmode)) {
		return (used);
	}

	i = recharge_failure_chance(obj, strength);
	/* Back-fire */
	if ((i <= 1) || one_in_(i)) {
		struct object *destroyed;
		bool none_left = false;

		msg("The recharge backfires!");
		msg("There is a bright flash of light.");

		/* Reduce and describe inventory */
		if (object_is_carried(player, obj)) {
			destroyed = gear_object_for_use(player, obj, 1, true,
				&none_left);
		} else {
			destroyed = floor_object_for_use(player, obj, 1, true,
				&none_left);
		}
		if (destroyed->known)
			object_delete(player->cave, NULL, &destroyed->known);
		object_delete(cave, player->cave, &destroyed);
	} else {
		/* Extract a "power" */
		int ease_of_recharge = (100 - obj->kind->level) / 10;
		t = (strength / (10 - ease_of_recharge)) + 1;

		/* Recharge based on the power */
		if (t > 0) obj->pval += 2 + randint1(t);
	}

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN);

	/* Something was done */
	return true;
}